

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O2

bool dxil_spv::emit_fmad_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Builder *this;
  Type *pTVar3;
  Operation *this_00;
  Value *pVVar4;
  Operation *this_01;
  uint i;
  uint index;
  ThreadLocalAllocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_50;
  
  this = Converter::Impl::builder(impl);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&local_50,"dx.precise",&local_51);
  bVar1 = LLVMBC::Instruction::hasMetadata(&instruction->super_Instruction,&local_50);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::_M_dispose(&local_50);
  }
  else {
    bVar1 = (impl->options).force_precise;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::_M_dispose(&local_50);
    if (bVar1 == false) {
      if (impl->glsl_std450_ext == 0) {
        IVar2 = spv::Builder::import(this,"GLSL.std.450");
        impl->glsl_std450_ext = IVar2;
      }
      this_01 = Converter::Impl::allocate(impl,OpExtInst,(Value *)instruction);
      Operation::add_id(this_01,impl->glsl_std450_ext);
      Operation::add_literal(this_01,0x32);
      for (index = 1; index != 4; index = index + 1) {
        pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
        IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
        Operation::add_id(this_01,IVar2);
      }
      Converter::Impl::add(impl,this_01,false);
      goto LAB_001578f4;
    }
  }
  pTVar3 = LLVMBC::Value::getType((Value *)instruction);
  IVar2 = Converter::Impl::get_type_id(impl,pTVar3,0);
  this_00 = Converter::Impl::allocate(impl,OpFMul,IVar2);
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  Operation::add_id(this_00,IVar2);
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  Operation::add_id(this_00,IVar2);
  Converter::Impl::add(impl,this_00,false);
  spv::Builder::addDecoration(this,this_00->id,DecorationNoContraction,-1);
  pTVar3 = LLVMBC::Value::getType((Value *)instruction);
  Converter::Impl::decorate_relaxed_precision(impl,pTVar3,this_00->id,false);
  this_01 = Converter::Impl::allocate(impl,OpFAdd,(Value *)instruction);
  Operation::add_id(this_01,this_00->id);
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
  IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  Operation::add_id(this_01,IVar2);
  Converter::Impl::add(impl,this_01,false);
  spv::Builder::addDecoration(this,this_01->id,DecorationNoContraction,-1);
LAB_001578f4:
  IVar2 = this_01->id;
  pTVar3 = LLVMBC::Value::getType((Value *)instruction);
  Converter::Impl::decorate_relaxed_precision(impl,pTVar3,IVar2,false);
  return true;
}

Assistant:

bool emit_fmad_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id result_id;

	if (instruction->hasMetadata("dx.precise") || impl.options.force_precise)
	{
		// DXIL docs says to split the expression explicitly.
		// HLSL docs says it just has to be invariant.
		// These conflict since we could have used NoContract FMA instead,
		// but at least Big Navi splits fmac into mul + add when doing nocontract fma(), so ...
		spv::Id type_id = impl.get_type_id(instruction->getType());
		Operation *mul_op = impl.allocate(spv::OpFMul, type_id);
		mul_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		mul_op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
		impl.add(mul_op);
		builder.addDecoration(mul_op->id, spv::DecorationNoContraction);

		impl.decorate_relaxed_precision(instruction->getType(), mul_op->id, false);

		Operation *add_op = impl.allocate(spv::OpFAdd, instruction);
		add_op->add_id(mul_op->id);
		add_op->add_id(impl.get_id_for_value(instruction->getOperand(3)));
		impl.add(add_op);
		builder.addDecoration(add_op->id, spv::DecorationNoContraction);

		result_id = add_op->id;
	}
	else
	{
		if (!impl.glsl_std450_ext)
			impl.glsl_std450_ext = builder.import("GLSL.std.450");

		Operation *op = impl.allocate(spv::OpExtInst, instruction);
		op->add_id(impl.glsl_std450_ext);
		op->add_literal(GLSLstd450Fma);
		for (unsigned i = 1; i < 4; i++)
			op->add_id(impl.get_id_for_value(instruction->getOperand(i)));
		impl.add(op);

		result_id = op->id;
	}

	impl.decorate_relaxed_precision(instruction->getType(), result_id, false);
	return true;
}